

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastCallback.cpp
# Opt level: O2

void __thiscall
btTriangleConvexcastCallback::processTriangle
          (btTriangleConvexcastCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  btVector3 *this_00;
  bool bVar1;
  btScalar bVar2;
  btGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;
  btContinuousConvexCollision convexCaster;
  btTriangleShape triangleShape;
  btVoronoiSimplexSolver simplexSolver;
  btConvexPenetrationDepthSolver local_300;
  btContinuousConvexCollision local_2f8;
  btTriangleShape local_2c8;
  CastResult local_248;
  btVoronoiSimplexSolver local_188;
  
  btTriangleShape::btTriangleShape(&local_2c8,triangle,triangle + 1,triangle + 2);
  local_2c8.super_btPolyhedralConvexShape.super_btConvexInternalShape.m_collisionMargin =
       this->m_triangleCollisionMargin;
  local_188.m_equalVertexThreshold = 0.0001;
  local_188.m_cachedBC.m_usedVertices._0_1_ = 0;
  local_300._vptr_btConvexPenetrationDepthSolver =
       (_func_int **)&PTR__btConvexPenetrationDepthSolver_001f0c08;
  btContinuousConvexCollision::btContinuousConvexCollision
            (&local_2f8,this->m_convexShape,(btConvexShape *)&local_2c8,&local_188,&local_300);
  local_248._vptr_CastResult = (_func_int **)&PTR_DebugDraw_001ecc78;
  local_248.m_debugDrawer = (btIDebugDraw *)0x0;
  local_248.m_fraction = 1.0;
  local_248.m_allowedPenetration = this->m_allowedPenetration;
  bVar1 = btContinuousConvexCollision::calcTimeOfImpact
                    (&local_2f8,&this->m_convexShapeFrom,&this->m_convexShapeTo,
                     &this->m_triangleToWorld,&this->m_triangleToWorld,&local_248);
  if (bVar1) {
    this_00 = &local_248.m_normal;
    bVar2 = btVector3::length2(this_00);
    if ((0.0001 < bVar2) && (local_248.m_fraction < this->m_hitFraction)) {
      btVector3::normalize(this_00);
      (*(this->super_btTriangleCallback)._vptr_btTriangleCallback[3])
                (local_248.m_fraction,this,this_00,&local_248.m_hitPoint,(ulong)(uint)partId,
                 (ulong)(uint)triangleIndex);
    }
  }
  btConvexCast::~btConvexCast(&local_2f8.super_btConvexCast);
  btPolyhedralConvexShape::~btPolyhedralConvexShape(&local_2c8.super_btPolyhedralConvexShape);
  return;
}

Assistant:

void
btTriangleConvexcastCallback::processTriangle (btVector3* triangle, int partId, int triangleIndex)
{
	btTriangleShape triangleShape (triangle[0], triangle[1], triangle[2]);
    triangleShape.setMargin(m_triangleCollisionMargin);

	btVoronoiSimplexSolver	simplexSolver;
	btGjkEpaPenetrationDepthSolver	gjkEpaPenetrationSolver;

//#define  USE_SUBSIMPLEX_CONVEX_CAST 1
//if you reenable USE_SUBSIMPLEX_CONVEX_CAST see commented out code below
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
	btSubsimplexConvexCast convexCaster(m_convexShape, &triangleShape, &simplexSolver);
#else
	//btGjkConvexCast	convexCaster(m_convexShape,&triangleShape,&simplexSolver);
	btContinuousConvexCollision convexCaster(m_convexShape,&triangleShape,&simplexSolver,&gjkEpaPenetrationSolver);
#endif //#USE_SUBSIMPLEX_CONVEX_CAST
	
	btConvexCast::CastResult castResult;
	castResult.m_fraction = btScalar(1.);
	castResult.m_allowedPenetration = m_allowedPenetration;
	if (convexCaster.calcTimeOfImpact(m_convexShapeFrom,m_convexShapeTo,m_triangleToWorld, m_triangleToWorld, castResult))
	{
		//add hit
		if (castResult.m_normal.length2() > btScalar(0.0001))
		{					
			if (castResult.m_fraction < m_hitFraction)
			{
/* btContinuousConvexCast's normal is already in world space */
/*
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
				//rotate normal into worldspace
				castResult.m_normal = m_convexShapeFrom.getBasis() * castResult.m_normal;
#endif //USE_SUBSIMPLEX_CONVEX_CAST
*/
				castResult.m_normal.normalize();

				reportHit (castResult.m_normal,
							castResult.m_hitPoint,
							castResult.m_fraction,
							partId,
							triangleIndex);
			}
		}
	}
}